

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O3

void vision_recalc(int control)

{
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  boolean bVar4;
  char cVar5;
  level *plVar6;
  xchar xVar7;
  byte bVar8;
  char **loc_cs_rows;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  uint uVar12;
  char *left_most;
  ulong uVar13;
  char cVar14;
  byte bVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  char cVar27;
  char *right_most;
  uchar *puVar28;
  char *pcVar29;
  bool bVar30;
  bool bVar31;
  long local_58;
  long local_48;
  
  vision_full_recalc = '\0';
  if (in_mklev != '\0') {
    vision_full_recalc = '\0';
    return;
  }
  if (iflags.vision_inited == '\0') {
    vision_full_recalc = '\0';
    return;
  }
  bVar31 = viz_array != cs_rows0;
  loc_cs_rows = cs_rows1;
  if (bVar31) {
    loc_cs_rows = cs_rows0;
  }
  left_most = cs_rmin0;
  if (!bVar31) {
    left_most = cs_rmin1;
  }
  right_most = cs_rmax0;
  if (!bVar31) {
    right_most = cs_rmax1;
  }
  memset(*loc_cs_rows,0,0x690);
  builtin_strncpy(left_most,"OOOOOOOOOOOOOOOOOOOOO",0x15);
  right_most[0] = '\0';
  right_most[1] = '\0';
  right_most[2] = '\0';
  right_most[3] = '\0';
  right_most[4] = '\0';
  right_most[5] = '\0';
  right_most[6] = '\0';
  right_most[7] = '\0';
  right_most[8] = '\0';
  right_most[9] = '\0';
  right_most[10] = '\0';
  right_most[0xb] = '\0';
  right_most[0xc] = '\0';
  right_most[0xd] = '\0';
  right_most[0xe] = '\0';
  right_most[0xf] = '\0';
  right_most[0xd] = '\0';
  right_most[0xe] = '\0';
  right_most[0xf] = '\0';
  right_most[0x10] = '\0';
  right_most[0x11] = '\0';
  right_most[0x12] = '\0';
  right_most[0x13] = '\0';
  right_most[0x14] = '\0';
  if ((control != 2) && ((u._1052_1_ & 1) == 0)) {
    if (u.uprops[0x1e].intrinsic != 0) {
LAB_00281b89:
      if (ublindf != (obj *)0x0) {
LAB_00281b8e:
        if (ublindf->oartifact == '\x1d') goto LAB_00281c8b;
      }
      lVar25 = 0;
      view_from((int)u.uy,(int)u.ux,loc_cs_rows,left_most,right_most,0,
                (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
      ppcVar3 = viz_array;
      viz_array = loc_cs_rows;
      do {
        cVar27 = viz_rmin[lVar25];
        cVar5 = left_most[lVar25];
        cVar14 = cVar5;
        if (cVar27 < cVar5) {
          cVar14 = cVar27;
        }
        cVar10 = right_most[lVar25];
        if (right_most[lVar25] < viz_rmax[lVar25]) {
          cVar10 = viz_rmax[lVar25];
        }
        if (cVar14 <= cVar10) {
          pcVar1 = ppcVar3[lVar25];
          if (cVar5 < cVar27) {
            cVar27 = cVar5;
          }
          lVar16 = (long)cVar27;
          do {
            if ((pcVar1[lVar16] & 2U) != 0) {
              newsym((int)lVar16,(int)lVar25);
            }
            bVar31 = lVar16 < cVar10;
            lVar16 = lVar16 + 1;
          } while (bVar31);
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0x15);
      goto LAB_00282708;
    }
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00281b8e;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00281b89;
LAB_00281c8b:
    bVar4 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar4 == '\0') {
      if (((u._1052_1_ & 2) == 0) ||
         (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 != '\0')) {
        if ((u.utrap == 0) || (u.utraptype != 1)) {
          bVar31 = false;
          view_from((int)u.uy,(int)u.ux,loc_cs_rows,left_most,right_most,0,
                    (_func_void_int_int_void_ptr *)0x0,(void *)0x0);
        }
        else {
          xVar7 = u.uy;
          uVar11 = (int)u.uy - 1;
          do {
            if (-1 < (int)uVar11) {
              if (0x14 < uVar11) break;
              cVar27 = u.ux;
              cVar5 = '\x01';
              if ('\x01' < cVar27) {
                cVar5 = cVar27;
              }
              bVar15 = cVar5 - 1;
              if ('M' < cVar27) {
                cVar27 = 'N';
              }
              left_most[uVar11] = bVar15;
              right_most[uVar11] = cVar27 + '\x01';
              if ((char)bVar15 <= (char)(cVar27 + '\x01')) {
                pcVar1 = loc_cs_rows[uVar11];
                lVar25 = (ulong)bVar15 - 1;
                do {
                  pcVar1[lVar25 + 1] = '\x03';
                  lVar25 = lVar25 + 1;
                } while (lVar25 < right_most[uVar11]);
                xVar7 = u.uy;
              }
            }
            bVar31 = (int)uVar11 <= (int)xVar7;
            uVar11 = uVar11 + 1;
          } while (bVar31);
          bVar31 = false;
        }
      }
      else {
        uVar20 = u._0_4_ & 0xff;
        uVar11 = (int)u.uy - 1;
        do {
          uVar24 = (ulong)((int)(char)uVar20 - 2);
          cVar27 = (char)uVar20 + -1;
          do {
            uVar20 = (uint)uVar24;
            uVar12 = uVar20 + 1;
            uVar24 = (ulong)uVar12;
            if (((uVar11 < 0x15) && (uVar20 < 0x4f)) &&
               (bVar4 = is_pool(level,uVar12,uVar11), bVar4 != '\0')) {
              cVar5 = left_most[uVar11];
              if ((int)uVar12 <= (int)left_most[uVar11]) {
                cVar5 = cVar27;
              }
              left_most[uVar11] = cVar5;
              cVar5 = cVar27;
              if ((int)uVar12 < (int)right_most[uVar11]) {
                cVar5 = right_most[uVar11];
              }
              right_most[uVar11] = cVar5;
              loc_cs_rows[uVar11][uVar24] = '\x03';
            }
            uVar20 = (uint)u.ux;
            cVar27 = cVar27 + '\x01';
          } while ((int)uVar12 <= (int)uVar20);
          bVar31 = (int)uVar11 <= (int)u.uy;
          uVar11 = uVar11 + 1;
        } while (bVar31);
        bVar31 = true;
      }
      uVar24 = (ulong)u.xray_range;
      if (-1 < (long)uVar24) {
        if (u.xray_range == 0) {
          loc_cs_rows[u.uy][u.ux] = loc_cs_rows[u.uy][u.ux] | 2;
          xVar7 = u.ux;
          lVar25 = (long)u.uy;
          level->locations[u.ux][lVar25].seenv = 0xff;
          cVar27 = left_most[lVar25];
          if (xVar7 < left_most[lVar25]) {
            cVar27 = xVar7;
          }
          left_most[lVar25] = cVar27;
          cVar27 = right_most[lVar25];
          if (right_most[lVar25] < xVar7) {
            cVar27 = xVar7;
          }
          right_most[lVar25] = cVar27;
        }
        else {
          iVar21 = (int)u.uy;
          if (iVar21 - u.xray_range <= u.xray_range + iVar21) {
            cVar27 = ""[uVar24];
            xVar7 = u.uy;
            uVar11 = iVar21 - u.xray_range;
            do {
              uVar9 = (ulong)uVar11;
              if (-1 < (int)uVar11) {
                if (0x14 < uVar11) break;
                uVar12 = iVar21 - uVar11;
                uVar20 = -uVar12;
                if (0 < (int)uVar12) {
                  uVar20 = uVar12;
                }
                uVar12 = (int)u.ux -
                         (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                              [(ulong)uVar20 + (long)cVar27];
                uVar26 = (ulong)uVar12;
                if ((int)uVar12 < 1) {
                  uVar26 = 0;
                }
                uVar20 = (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                              [(ulong)uVar20 + (long)cVar27] + (int)u.ux;
                uVar13 = (ulong)uVar20;
                if (0x4e < (int)uVar20) {
                  uVar13 = 0x4f;
                }
                if ((int)uVar26 <= (int)uVar13) {
                  pcVar1 = loc_cs_rows[uVar9];
                  lVar25 = uVar26 * 0xfc + uVar9 * 0xc + 0x45;
                  uVar24 = uVar26;
                  do {
                    bVar15 = pcVar1[uVar24];
                    pcVar1[uVar24] = bVar15 | 2;
                    cVar5 = level->levname[lVar25];
                    level->levname[lVar25] = -1;
                    if (((bVar15 & 2) == 0) || (cVar5 != -1)) {
                      newsym((int)uVar24,uVar11);
                    }
                    lVar25 = lVar25 + 0xfc;
                    bVar30 = uVar24 < uVar13;
                    uVar24 = uVar24 + 1;
                  } while (bVar30);
                  uVar24 = (ulong)(uint)u.xray_range;
                  xVar7 = u.uy;
                }
                cVar5 = left_most[uVar9];
                if ((int)uVar26 < (int)cVar5) {
                  cVar5 = (char)uVar26;
                }
                left_most[uVar9] = cVar5;
                cVar5 = right_most[uVar9];
                if ((int)cVar5 < (int)uVar13) {
                  cVar5 = (char)uVar13;
                }
                right_most[uVar9] = cVar5;
              }
              iVar21 = (int)xVar7;
              bVar30 = (int)uVar11 < (int)uVar24 + iVar21;
              uVar11 = uVar11 + 1;
            } while (bVar30);
          }
        }
      }
      if ((!bVar31) && (uVar24 = (ulong)(uint)u.nv_range, u.xray_range < u.nv_range)) {
        if (u.nv_range == 0) {
          loc_cs_rows[u.uy][u.ux] = loc_cs_rows[u.uy][u.ux] | 2;
          xVar7 = u.ux;
          lVar25 = (long)u.uy;
          level->locations[u.ux][lVar25].seenv = 0xff;
          cVar27 = left_most[lVar25];
          if (xVar7 < left_most[lVar25]) {
            cVar27 = xVar7;
          }
          left_most[lVar25] = cVar27;
          cVar27 = right_most[lVar25];
          if (right_most[lVar25] < xVar7) {
            cVar27 = xVar7;
          }
          right_most[lVar25] = cVar27;
        }
        else if (0 < u.nv_range) {
          iVar21 = (int)u.uy;
          if (iVar21 - u.nv_range <= u.nv_range + iVar21) {
            cVar27 = ""[uVar24];
            xVar7 = u.uy;
            uVar11 = iVar21 - u.nv_range;
            do {
              if (-1 < (int)uVar11) {
                if (0x14 < uVar11) break;
                uVar12 = iVar21 - uVar11;
                uVar20 = -uVar12;
                if (0 < (int)uVar12) {
                  uVar20 = uVar12;
                }
                uVar12 = (int)u.ux -
                         (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                              [(ulong)uVar20 + (long)cVar27];
                if ((int)uVar12 < 1) {
                  uVar12 = 0;
                }
                uVar20 = (int)"\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                              [(ulong)uVar20 + (long)cVar27] + (int)u.ux;
                if (0x4e < (int)uVar20) {
                  uVar20 = 0x4f;
                }
                if ((int)uVar12 <= (int)uVar20) {
                  pcVar1 = loc_cs_rows[uVar11];
                  uVar24 = (ulong)uVar12 - 1;
                  do {
                    bVar15 = pcVar1[uVar24 + 1];
                    if (bVar15 != 0) {
                      pcVar1[uVar24 + 1] = bVar15 | 2;
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar24 < uVar20);
                  uVar24 = (ulong)(uint)u.nv_range;
                  xVar7 = u.uy;
                }
                cVar5 = left_most[uVar11];
                if ((int)uVar12 < (int)cVar5) {
                  cVar5 = (char)uVar12;
                }
                left_most[uVar11] = cVar5;
                cVar5 = right_most[uVar11];
                if ((int)cVar5 < (int)uVar20) {
                  cVar5 = (char)uVar20;
                }
                right_most[uVar11] = cVar5;
              }
              iVar21 = (int)xVar7;
              bVar31 = (int)uVar11 < (int)uVar24 + iVar21;
              uVar11 = uVar11 + 1;
            } while (bVar31);
          }
        }
      }
    }
    else {
      lVar25 = (long)u.ux;
      lVar16 = (long)u.uy;
      uVar11 = *(ushort *)&level->locations[lVar25][lVar16].field_0x8 & 0x3f;
      plVar6 = level;
      if (2 < uVar11) {
        uVar24 = (ulong)(uVar11 - 3);
        iVar21 = (int)level->rooms[uVar24].ly;
        if (iVar21 + -1 <= level->rooms[uVar24].hy + 1) {
          pcVar1 = level->levname + uVar24 * 0xd8;
          lVar25 = (long)iVar21 * 0xc + -0xc3;
          lVar16 = (long)iVar21 + -1;
          do {
            iVar17 = (int)((mkroom *)(pcVar1 + 0xb960))->lx;
            left_most[lVar16] = (char)(iVar17 + -1);
            iVar19 = (int)plVar6->rooms[uVar24].hx;
            iVar21 = iVar19 + 1;
            right_most[lVar16] = (char)iVar21;
            if (iVar17 + -1 <= iVar21) {
              lVar18 = (long)iVar17 + -2;
              lVar22 = (long)iVar17 * 0xfc + lVar25;
              do {
                if (plVar6->rooms[uVar24].rlit == '\0') {
                  loc_cs_rows[lVar16][lVar18 + 1] = '\x01';
                  plVar6 = level;
                }
                else {
                  loc_cs_rows[lVar16][lVar18 + 1] = '\x03';
                  plVar6 = level;
                  level->levname[lVar22] = -1;
                }
                lVar18 = lVar18 + 1;
                lVar22 = lVar22 + 0xfc;
              } while (lVar18 <= iVar19);
            }
            pcVar1 = plVar6->levname + uVar24 * 0xd8;
            lVar25 = lVar25 + 0xc;
            bVar31 = lVar16 <= pcVar1[0xb963];
            lVar16 = lVar16 + 1;
          } while (bVar31);
          lVar25 = (long)u.ux;
          lVar16 = (long)u.uy;
        }
      }
      uVar20 = (uint)u.uy;
      uVar11 = 1;
      if (1 < (int)uVar20) {
        uVar11 = uVar20;
      }
      uVar12 = 0x13;
      if ((int)uVar20 < 0x13) {
        uVar12 = uVar20;
      }
      uVar20 = (uint)u.ux;
      uVar24 = 2;
      if (2 < (int)uVar20) {
        uVar24 = (ulong)uVar20;
      }
      uVar23 = 0x4e;
      if ((int)uVar20 < 0x4e) {
        uVar23 = uVar20;
      }
      if ((int)(uVar11 - 1) <= (int)(uVar12 + 1)) {
        cVar27 = plVar6->locations[lVar25][lVar16].typ;
        iVar21 = (int)uVar24 + -1;
        uVar9 = (ulong)uVar11 - 1;
        do {
          if ((int)uVar24 <= (int)left_most[uVar9]) {
            left_most[uVar9] = (char)iVar21;
          }
          if ((int)right_most[uVar9] <= (int)uVar23) {
            right_most[uVar9] = (char)(uVar23 + 1);
          }
          uVar26 = uVar24 - 1;
          if (iVar21 <= (int)(uVar23 + 1)) {
            do {
              loc_cs_rows[uVar9][uVar26] = '\x03';
              if ((cVar27 == '\x17') && ((uVar26 == (uint)(int)u.ux || (uVar9 == (uint)(int)u.uy))))
              {
                newsym((int)uVar26,(int)uVar9);
              }
              bVar31 = (long)uVar26 <= (long)(int)uVar23;
              uVar26 = uVar26 + 1;
            } while (bVar31);
          }
          bVar31 = (long)uVar9 <= (long)(int)uVar12;
          uVar9 = uVar9 + 1;
        } while (bVar31);
      }
    }
  }
  do_light_sources(loc_cs_rows);
  ppcVar3 = viz_array;
  lVar25 = (long)u.ux;
  viz_array = loc_cs_rows;
  (vision_recalc::colbump + lVar25)[0] = '\x01';
  (vision_recalc::colbump + lVar25)[1] = '\x01';
  local_58 = 0x46;
  local_48 = 0;
  uVar24 = 0;
  do {
    cVar27 = left_most[uVar24];
    if (viz_rmin[uVar24] < left_most[uVar24]) {
      cVar27 = viz_rmin[uVar24];
    }
    cVar5 = right_most[uVar24];
    if (right_most[uVar24] < viz_rmax[uVar24]) {
      cVar5 = viz_rmax[uVar24];
    }
    if (cVar27 <= cVar5) {
      pcVar1 = loc_cs_rows[uVar24];
      lVar25 = 0;
      if (u.ux <= cVar27) {
        lVar25 = (ulong)(u.ux < cVar27) + 1;
      }
      uVar11 = (uint)(uVar24 != (uint)(int)u.uy);
      if ((long)u.uy < (long)uVar24) {
        uVar11 = 0xffffffff;
      }
      pcVar2 = ppcVar3[uVar24];
      puVar28 = seenv_matrix[uVar11 + 1] + lVar25;
      iVar21 = uVar11 + (int)uVar24;
      lVar16 = (long)cVar27 * 0xfc;
      pcVar29 = level->levname + local_58;
      lVar25 = (long)cVar27;
      do {
        bVar15 = pcVar1[lVar25];
        if ((bVar15 & 2) == 0) {
          if (((bVar15 & 1) != 0) &&
             ((bVar15 & 4) != 0 || (*(uint *)(pcVar29 + lVar16) & 0x400) != 0)) {
            cVar27 = pcVar29[lVar16 + -2];
            if ((cVar27 != '\0') &&
               ((((cVar27 == '\x0f' || (cVar27 == '\x17')) || (cVar27 < '\r')) &&
                (viz_clear[0][local_48 + lVar25] == '\0')))) {
              uVar9 = (ulong)(lVar25 != u.ux);
              if (u.ux < lVar25) {
                uVar9 = 0xffffffffffffffff;
              }
              if (((level->locations[uVar9 + lVar25][iVar21].field_0x7 & 4) == 0) &&
                 ((loc_cs_rows[iVar21][lVar25 + uVar9] & 4U) == 0)) goto LAB_00282680;
            }
            pcVar1[lVar25] = bVar15 | 2;
            goto LAB_00282651;
          }
          if (((bVar15 & 1) != 0) && ((*(uint *)(pcVar29 + lVar16) >> 0xb & 1) != 0)) {
            *(uint *)(pcVar29 + lVar16) = *(uint *)(pcVar29 + lVar16) & 0xfffff7ff;
            goto LAB_002826a5;
          }
LAB_00282680:
          bVar8 = pcVar2[lVar25];
          if (((bVar8 & 2) != 0) || ((bVar8 & 1) != (bVar15 & 1))) goto LAB_002826a5;
        }
        else {
LAB_00282651:
          bVar15 = pcVar29[lVar16 + -1];
          bVar8 = *puVar28 | bVar15;
          pcVar29[lVar16 + -1] = bVar8;
          if (((pcVar2[lVar25] & 2U) == 0) || (bVar15 != bVar8)) {
LAB_002826a5:
            newsym((int)lVar25,(int)uVar24);
          }
        }
        puVar28 = puVar28 + vision_recalc::colbump[lVar25 + 1];
        pcVar29 = pcVar29 + 0xfc;
        bVar31 = lVar25 < cVar5;
        lVar25 = lVar25 + 1;
      } while (bVar31);
    }
    uVar24 = uVar24 + 1;
    local_48 = local_48 + 0x50;
    local_58 = local_58 + 0xc;
  } while (uVar24 != 0x15);
  lVar25 = (long)u.ux;
  (vision_recalc::colbump + lVar25)[0] = '\0';
  (vision_recalc::colbump + lVar25)[1] = '\0';
LAB_00282708:
  if (program_state.panicking == 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  viz_rmin = left_most;
  viz_rmax = right_most;
  return;
}

Assistant:

void vision_recalc(int control)
{
    char **temp_array;	/* points to the old vision array */
    char **next_array;	/* points to the new vision array */
    char *next_row;	/* row pointer for the new array */
    char *old_row;	/* row pointer for the old array */
    char *next_rmin;	/* min pointer for the new array */
    char *next_rmax;	/* max pointer for the new array */
    const char *ranges;	/* circle ranges -- used for xray & night vision */
    int row;		/* row counter (outer loop)  */
    int start, stop;	/* inner loop starting/stopping index */
    int dx, dy;		/* one step from a lit door or lit wall (see below) */
    int col;	/* inner loop counter */
    struct rm *loc;	/* pointer to current pos */
    struct rm *flev;	/* pointer to position in "front" of current pos */
    extern unsigned char seenv_matrix[3][3];	/* from display.c */
    static unsigned char colbump[COLNO+1];	/* cols to bump sv */
    unsigned char *sv;				/* ptr to seen angle bits */
    int oldseenv;				/* previous seenv value */

    vision_full_recalc = 0;			/* reset flag */
    if (in_mklev || !iflags.vision_inited) return;

    /*
     * Either the light sources have been taken care of, or we must
     * recalculate them here.
     */

    /* Get the unused could see, row min, and row max arrays. */
    get_unused_cs(&next_array, &next_rmin, &next_rmax);

    /* You see nothing, nothing can see you --- if swallowed or refreshing. */
    if (u.uswallow || control == 2) {
	/* do nothing -- get_unused_cs() nulls out the new work area */

    } else if (Blind) {
	/*
	 * Calculate the could_see array even when blind so that monsters
	 * can see you, even if you can't see them.  Note that the current
	 * setup allows:
	 *
	 *	+ Monsters to see with the "new" vision, even on the rogue
	 *	  level.
	 *
	 *	+ Monsters can see you even when you're in a pit.
	 */
	view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Our own version of the update loop below.  We know we can't see
	 * anything, so we only need update positions we used to be able
	 * to see.
	 */
	temp_array = viz_array;	/* set viz_array so newsym() will work */
	viz_array = next_array;

	for (row = 0; row < ROWNO; row++) {
	    old_row = temp_array[row];

	    /* Find the min and max positions on the row. */
	    start = min(viz_rmin[row], next_rmin[row]);
	    stop  = max(viz_rmax[row], next_rmax[row]);

	    for (col = start; col <= stop; col++)
		if (old_row[col] & IN_SIGHT) newsym(col,row);
	}

	/* skip the normal update loop */
	goto skip;
    }
    else if (Is_rogue_level(&u.uz)) {
	rogue_vision(next_array,next_rmin,next_rmax);
    }
    else {
	int has_night_vision = 1;	/* hero has night vision */

	if (Underwater && !Is_waterlevel(&u.uz)) {
	    /*
	     * The hero is under water.  Only see surrounding locations if
	     * they are also underwater.  This overrides night vision but
	     * does not override x-ray vision.
	     */
	    has_night_vision = 0;

	    for (row = u.uy-1; row <= u.uy+1; row++)
		for (col = u.ux-1; col <= u.ux+1; col++) {
		    if (!isok(col,row) || !is_pool(level, col,row)) continue;

		    next_rmin[row] = min(next_rmin[row], col);
		    next_rmax[row] = max(next_rmax[row], col);
		    next_array[row][col] = IN_SIGHT | COULD_SEE;
		}
	}

	/* if in a pit, just update for immediate locations */
	else if (u.utrap && u.utraptype == TT_PIT) {
	    for (row = u.uy-1; row <= u.uy+1; row++) {
		if (row < 0) continue;	if (row >= ROWNO) break;

		next_rmin[row] = max(      0, u.ux - 1);
		next_rmax[row] = min(COLNO-1, u.ux + 1);
		next_row = next_array[row];

		for (col=next_rmin[row]; col <= next_rmax[row]; col++)
		    next_row[col] = IN_SIGHT | COULD_SEE;
	    }
	} else
	    view_from(u.uy, u.ux, next_array, next_rmin, next_rmax,
		0, (void (*)(int,int,void *))0, 0);

	/*
	 * Set the IN_SIGHT bit for xray and night vision.
	 */
	if (u.xray_range >= 0) {
	    if (u.xray_range) {
		ranges = circle_ptr(u.xray_range);

		for (row = u.uy-u.xray_range; row <= u.uy+u.xray_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++) {
			char old_row_val = next_row[col];
			next_row[col] |= IN_SIGHT;
			oldseenv = level->locations[col][row].seenv;
			level->locations[col][row].seenv = SVALL;	/* see all! */
			/* Update if previously not in sight or new angle. */
			if (!(old_row_val & IN_SIGHT) || oldseenv != SVALL)
			    newsym(col,row);
		    }

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}

	    } else {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    }
	}

	if (has_night_vision && u.xray_range < u.nv_range) {
	    if (!u.nv_range) {	/* range is 0 */
		next_array[u.uy][u.ux] |= IN_SIGHT;
		level->locations[u.ux][u.uy].seenv = SVALL;
		next_rmin[u.uy] = min(u.ux, next_rmin[u.uy]);
		next_rmax[u.uy] = max(u.ux, next_rmax[u.uy]);
	    } else if (u.nv_range > 0) {
		ranges = circle_ptr(u.nv_range);

		for (row = u.uy-u.nv_range; row <= u.uy+u.nv_range; row++) {
		    if (row < 0) continue;	if (row >= ROWNO) break;
		    dy = v_abs(u.uy-row);	next_row = next_array[row];

		    start = max(      0, u.ux - ranges[dy]);
		    stop  = min(COLNO-1, u.ux + ranges[dy]);

		    for (col = start; col <= stop; col++)
			if (next_row[col]) next_row[col] |= IN_SIGHT;

		    next_rmin[row] = min(start, next_rmin[row]);
		    next_rmax[row] = max(stop, next_rmax[row]);
		}
	    }
	}
    }

    /* Set the correct bits for all light sources. */
    do_light_sources(next_array);


    /*
     * Make the viz_array the new array so that cansee() will work correctly.
     */
    temp_array = viz_array;
    viz_array = next_array;

    /*
     * The main update loop.  Here we do two things:
     *
     *	    + Set the IN_SIGHT bit for places that we could see and are lit.
     *	    + Reset changed places.
     *
     * There is one thing that make deciding what the hero can see
     * difficult:
     *
     *  1.  Directional lighting.  Items that block light create problems.
     *      The worst offenders are doors.  Suppose a door to a lit room
     *      is closed.  It is lit on one side, but not on the other.  How
     *      do you know?  You have to check the closest adjacent position.
     *	    Even so, that is not entirely correct.  But it seems close
     *	    enough for now.
     */
    colbump[u.ux] = colbump[u.ux+1] = 1;
    for (row = 0; row < ROWNO; row++) {
	dy = u.uy - row;                dy = sign(dy);
	next_row = next_array[row];     old_row = temp_array[row];

	/* Find the min and max positions on the row. */
	start = min(viz_rmin[row], next_rmin[row]);
	stop  = max(viz_rmax[row], next_rmax[row]);
	loc = &level->locations[start][row];

	sv = &seenv_matrix[dy+1][start < u.ux ? 0 : (start > u.ux ? 2:1)];

	for (col = start; col <= stop;
				loc += ROWNO, sv += (int) colbump[++col]) {
	    if (next_row[col] & IN_SIGHT) {
		/*
		 * We see this position because of night- or xray-vision.
		 */
		oldseenv = loc->seenv;
		loc->seenv |= new_angle(loc,sv,row,col); /* update seen angle */

		/* Update pos if previously not in sight or new angle. */
		if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
		    newsym(col,row);
	    }

	    else if ((next_row[col] & COULD_SEE)
				&& (loc->lit || (next_row[col] & TEMP_LIT))) {
		/*
		 * We see this position because it is lit.
		 */
		if ((IS_DOOR(loc->typ) || loc->typ == SDOOR ||
		     IS_WALL(loc->typ)) && !viz_clear[row][col]) {
		    /*
		     * Make sure doors, walls, boulders or mimics don't show up
		     * at the end of dark hallways.  We do this by checking
		     * the adjacent position.  If it is lit, then we can see
		     * the door or wall, otherwise we can't.
		     */
		    dx = u.ux - col;	dx = sign(dx);
		    flev = &(level->locations[col+dx][row+dy]);
		    if (flev->lit || next_array[row+dy][col+dx] & TEMP_LIT) {
			next_row[col] |= IN_SIGHT;	/* we see it */

			oldseenv = loc->seenv;
			loc->seenv |= new_angle(loc,sv,row,col);

			/* Update pos if previously not in sight or new angle.*/
			if (!(old_row[col] & IN_SIGHT) || oldseenv!=loc->seenv)
			    newsym(col,row);
		    } else
			goto not_in_sight;	/* we don't see it */

		} else {
		    next_row[col] |= IN_SIGHT;	/* we see it */

		    oldseenv = loc->seenv;
		    loc->seenv |= new_angle(loc,sv,row,col);

		    /* Update pos if previously not in sight or new angle. */
		    if ( !(old_row[col] & IN_SIGHT) || oldseenv != loc->seenv)
			newsym(col,row);
		}
	    } else if ((next_row[col] & COULD_SEE) && loc->waslit) {
		/*
		 * If we make it here, the hero _could see_ the location,
		 * but doesn't see it (location is not lit).
		 * However, the hero _remembers_ it as lit (waslit is true).
		 * The hero can now see that it is not lit, so change waslit
		 * and update the location.
		 */
		loc->waslit = 0; /* remember lit condition */
		newsym(col,row);
	    }
	    /*
	     * At this point we know that the row position is *not* in normal
	     * sight.  That is, the position is could be seen, but is dark
	     * or LOS is just plain blocked.
	     *
	     * Update the position if:
	     * o If the old one *was* in sight.  We may need to clean up
	     *   the glyph -- E.g. darken room spot, etc.
	     * o If we now could see the location (yet the location is not
	     *   lit), but previously we couldn't see the location, or vice
	     *   versa.  Update the spot because there there may be an infared
	     *   monster there.
	     */
	    else {
not_in_sight:
		if ((old_row[col] & IN_SIGHT)
			|| ((next_row[col] & COULD_SEE)
				^ (old_row[col] & COULD_SEE)))
		    newsym(col,row);
	    }

	} /* end for col . . */
    }	/* end for row . .  */
    colbump[u.ux] = colbump[u.ux+1] = 0;

skip:
    /* This newsym() caused a crash delivering msg about failure to open
     * dungeon file init_dungeons() -> panic() -> done(11) ->
     * vision_recalc(2) -> newsym() -> crash!  u.ux and u.uy are 0 and
     * program_state.panicking == 1 under those circumstances
     */
    if (!program_state.panicking)
	newsym(u.ux, u.uy);		/* Make sure the hero shows up! */

    /* Set the new min and max pointers. */
    viz_rmin  = next_rmin;
    viz_rmax = next_rmax;
}